

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

HighsInt maxNameLength(HighsInt num_name,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *names)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (0 < num_name) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)&((names->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar2
                      );
      if (iVar1 < iVar3) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      lVar2 = lVar2 + 0x20;
    } while ((ulong)(uint)num_name << 5 != lVar2);
    return iVar3;
  }
  return 0;
}

Assistant:

HighsInt maxNameLength(const HighsInt num_name,
                       const std::vector<std::string>& names) {
  HighsInt max_name_length = 0;
  for (HighsInt ix = 0; ix < num_name; ix++)
    max_name_length = std::max((HighsInt)names[ix].length(), max_name_length);
  return max_name_length;
}